

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

int xmlSchematronUnregisterVariables(xmlXPathContextPtr ctxt,xmlSchematronLetPtr_conflict let)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  
  if (let == (xmlSchematronLetPtr_conflict)0x0) {
    return 0;
  }
  do {
    iVar2 = xmlXPathRegisterVariableNS(ctxt,let->name,(xmlChar *)0x0,(xmlXPathObjectPtr)0x0);
    if (iVar2 != 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Unregistering a let variable failed\n");
      return -1;
    }
    let = let->next;
  } while (let != (xmlSchematronLetPtr)0x0);
  return 0;
}

Assistant:

static int
xmlSchematronUnregisterVariables(xmlXPathContextPtr ctxt, xmlSchematronLetPtr let)
{
    while (let != NULL) {
        if (xmlXPathRegisterVariableNS(ctxt, let->name, NULL, NULL)) {
            xmlGenericError(xmlGenericErrorContext,
                            "Unregistering a let variable failed\n");
            return -1;
        }
        let = let->next;
    }
    return 0;
}